

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O0

bool __thiscall
test_CESkyCoord::test_coords
          (test_CESkyCoord *this,CESkyCoord *test,CESkyCoord *expected,string *func,int *line)

{
  bool bVar1;
  CESkyCoordType CVar2;
  CESkyCoordType CVar3;
  undefined8 in_RCX;
  CESkyCoord *in_RDX;
  CESkyCoord *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  CEDate *this_00;
  bool pass;
  undefined8 in_stack_fffffffffffffc60;
  CEDateType date_format;
  double in_stack_fffffffffffffc68;
  CESkyCoord *pCVar8;
  CEDate *in_stack_fffffffffffffc70;
  CESkyCoord *in_stack_fffffffffffffca8;
  CESkyCoord *in_stack_fffffffffffffcb0;
  CEAngle local_2d0;
  undefined1 local_2c0 [64];
  CEAngle local_280;
  undefined1 local_270 [64];
  CEAngle local_230;
  undefined1 local_220 [64];
  CEAngle local_1e0;
  undefined1 local_1d0 [64];
  CEAngle local_190;
  undefined1 local_180 [64];
  CEAngle local_140;
  undefined1 local_130 [64];
  CEAngle local_f0;
  undefined1 local_e0 [64];
  CEAngle local_a0 [2];
  undefined1 local_80 [64];
  CEAngle local_40;
  byte local_29;
  undefined8 local_28;
  undefined8 local_20;
  CESkyCoord *local_18;
  CESkyCoord *local_10;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffc60 >> 0x20);
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = operator==(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  local_29 = (**(code **)(*in_RDI + 0x68))(in_RDI,bVar1,1,local_20,local_28);
  local_29 = local_29 & 1;
  if (local_29 == 0) {
    CVar2 = CESkyCoord::GetCoordSystem(local_10);
    CVar3 = CESkyCoord::GetCoordSystem(local_18);
    printf("     CoordSys (1 v 2): %d v %d\n",(ulong)CVar2,(ulong)CVar3);
    pCVar8 = local_10;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[3])(&local_40,pCVar8,local_80);
    dVar4 = CEAngle::Deg(&local_40);
    pCVar8 = local_18;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[3])(local_a0,pCVar8,local_e0);
    dVar5 = CEAngle::Deg(local_a0);
    pCVar8 = local_10;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[3])(&local_f0,pCVar8,local_130);
    dVar6 = CEAngle::Deg(&local_f0);
    pCVar8 = local_18;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[3])(&local_140,pCVar8,local_180);
    dVar7 = CEAngle::Deg(&local_140);
    printf("     XCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n",dVar4,dVar5,
           (dVar6 - dVar7) * 3600.0);
    CEAngle::~CEAngle((CEAngle *)0x124eae);
    CEDate::~CEDate((CEDate *)0x124ebb);
    CEAngle::~CEAngle((CEAngle *)0x124ec8);
    CEDate::~CEDate((CEDate *)0x124ed5);
    CEAngle::~CEAngle((CEAngle *)0x124ee2);
    CEDate::~CEDate((CEDate *)0x124eef);
    CEAngle::~CEAngle((CEAngle *)0x124efc);
    CEDate::~CEDate((CEDate *)0x124f09);
    pCVar8 = local_10;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[4])(&local_190,pCVar8,local_1d0);
    dVar4 = CEAngle::Deg(&local_190);
    pCVar8 = local_18;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[4])(&local_1e0,pCVar8,local_220);
    dVar5 = CEAngle::Deg(&local_1e0);
    pCVar8 = local_10;
    CppEphem::julian_date_J2000();
    CEDate::CEDate(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,date_format);
    (*pCVar8->_vptr_CESkyCoord[4])(&local_230,pCVar8,local_270);
    dVar6 = CEAngle::Deg(&local_230);
    pCVar8 = local_18;
    this_00 = (CEDate *)CppEphem::julian_date_J2000();
    CEDate::CEDate(this_00,(double)pCVar8,date_format);
    (*pCVar8->_vptr_CESkyCoord[4])(&local_280,pCVar8,local_2c0);
    dVar7 = CEAngle::Deg(&local_280);
    printf("     YCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n",dVar4,dVar5,
           (dVar6 - dVar7) * 3600.0);
    CEAngle::~CEAngle((CEAngle *)0x1250d8);
    CEDate::~CEDate((CEDate *)0x1250e5);
    CEAngle::~CEAngle((CEAngle *)0x1250f2);
    CEDate::~CEDate((CEDate *)0x1250ff);
    CEAngle::~CEAngle((CEAngle *)0x12510c);
    CEDate::~CEDate((CEDate *)0x125119);
    CEAngle::~CEAngle((CEAngle *)0x125126);
    CEDate::~CEDate((CEDate *)0x125133);
    (*local_10->_vptr_CESkyCoord[2])(&local_2d0,local_10,local_18);
    dVar4 = CEAngle::Deg(&local_2d0);
    printf("     AngSep: %e arcsec\n",dVar4 * 3600.0);
    CEAngle::~CEAngle((CEAngle *)0x12519a);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool test_CESkyCoord::test_coords(const CESkyCoord&  test,
                                  const CESkyCoord&  expected,
                                  const std::string& func,
                                  const int&         line)
{
    // Test if the coordinates are equal
    bool pass = test_bool((test == expected), true, func, line);
    if (!pass) {
        std::printf("     CoordSys (1 v 2): %d v %d\n",
                    int(test.GetCoordSystem()), int(expected.GetCoordSystem()));
        std::printf("     XCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n", 
                    test.XCoord().Deg(), expected.XCoord().Deg(), 
                    (test.XCoord().Deg()-expected.XCoord().Deg())*3600.0);
        std::printf("     YCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n", 
                    test.YCoord().Deg(), expected.YCoord().Deg(), 
                    (test.YCoord().Deg()-expected.YCoord().Deg())*3600.0);
        std::printf("     AngSep: %e arcsec\n", 
                    test.AngularSeparation(expected).Deg()*3600.0);
    }
    return pass;
}